

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O3

RK_S32 h264e_slice_update(H264eSlice *slice,MppEncCfgSet *cfg,H264eSps *sps,H264ePps *pps,
                         H264eDpbFrm *frm)

{
  undefined8 uVar1;
  RK_S32 RVar2;
  int iVar3;
  RK_U32 RVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar8 = *(uint *)&frm->status >> 5 & 1;
  RVar2 = sps->pic_height_in_mbs;
  slice->mb_w = sps->pic_width_in_mbs;
  slice->mb_h = RVar2;
  slice->max_num_ref_frames = sps->num_ref_frames;
  slice->log2_max_frame_num = sps->log2_max_frame_num_minus4 + 4;
  iVar7 = sps->log2_max_poc_lsb_minus4 + 4;
  slice->log2_max_poc_lsb = iVar7;
  RVar4 = (cfg->codec).field_1.h264.entropy_coding_mode;
  slice->entropy_coding_mode = RVar4;
  slice->pic_order_cnt_type = sps->pic_order_cnt_type;
  slice->qp_init = pps->pic_init_qp;
  iVar3 = uVar8 + 2;
  if (((ulong)frm->status & 0x40) != 0) {
    iVar3 = 0;
  }
  slice->nal_reference_idc = iVar3;
  slice->nalu_type = uVar8 * 4 + 1;
  slice->first_mb_in_slice = 0;
  slice->slice_type = uVar8 * 2;
  slice->pic_parameter_set_id = 0;
  slice->frame_num = frm->frame_num;
  slice->num_ref_idx_override = 0;
  slice->qp_delta = 0;
  if (RVar4 == 0) {
    RVar4 = 0xffffffff;
  }
  else {
    RVar4 = (cfg->codec).field_1.h264.cabac_init_idc;
  }
  slice->cabac_init_idc = RVar4;
  uVar1 = *(undefined8 *)((long)&(cfg->codec).field_1 + 0x54);
  slice->disable_deblocking_filter_idc = (int)uVar1;
  slice->slice_alpha_c0_offset_div2 = (int)((ulong)uVar1 >> 0x20);
  slice->slice_beta_offset_div2 = (cfg->codec).field_1.h264.deblock_offset_beta;
  slice->idr_flag = uVar8;
  if (uVar8 != 0) {
    slice->idr_pic_id = slice->next_idr_pic_id;
    uVar5 = slice->next_idr_pic_id + 1;
    uVar6 = 0;
    if (uVar5 < 0x10) {
      uVar6 = uVar5;
    }
    slice->next_idr_pic_id = uVar6;
  }
  uVar6 = 0;
  slice->pic_order_cnt_lsb = ~(-1 << ((byte)iVar7 & 0x1f)) & frm->poc;
  slice->num_ref_idx_active = 1;
  slice->no_output_of_prior_pics = 0;
  if (uVar8 != 0) {
    uVar6 = *(uint *)&frm->status >> 7 & 1;
  }
  slice->long_term_reference_flag = uVar6;
  return 0;
}

Assistant:

RK_S32 h264e_slice_update(H264eSlice *slice, MppEncCfgSet *cfg,
                          H264eSps *sps, H264ePps *pps, H264eDpbFrm *frm)
{
    MppEncH264Cfg *h264 = &cfg->codec.h264;
    RK_S32 is_idr = frm->status.is_idr;

    slice->mb_w = sps->pic_width_in_mbs;
    slice->mb_h = sps->pic_height_in_mbs;
    slice->max_num_ref_frames = sps->num_ref_frames;
    slice->log2_max_frame_num = sps->log2_max_frame_num_minus4 + 4;
    slice->log2_max_poc_lsb = sps->log2_max_poc_lsb_minus4 + 4;
    slice->entropy_coding_mode = h264->entropy_coding_mode;
    slice->pic_order_cnt_type = sps->pic_order_cnt_type;
    slice->qp_init = pps->pic_init_qp;

    slice->nal_reference_idc = (frm->status.is_non_ref) ? (H264_NALU_PRIORITY_DISPOSABLE) :
                               (is_idr) ? (H264_NALU_PRIORITY_HIGHEST) :
                               (H264_NALU_PRIORITY_HIGH);
    slice->nalu_type = (is_idr) ? (H264_NALU_TYPE_IDR) : (H264_NALU_TYPE_SLICE);

    slice->first_mb_in_slice = 0;
    slice->slice_type = (is_idr) ? (H264_I_SLICE) : (H264_P_SLICE);
    slice->pic_parameter_set_id = 0;
    slice->frame_num = frm->frame_num;
    slice->num_ref_idx_override = 0;
    slice->qp_delta = 0;
    slice->cabac_init_idc = h264->entropy_coding_mode ? h264->cabac_init_idc : -1;
    slice->disable_deblocking_filter_idc = h264->deblock_disable;
    slice->slice_alpha_c0_offset_div2 = h264->deblock_offset_alpha;
    slice->slice_beta_offset_div2 = h264->deblock_offset_beta;

    slice->idr_flag = is_idr;

    if (slice->idr_flag) {
        slice->idr_pic_id = slice->next_idr_pic_id;
        slice->next_idr_pic_id++;
        if (slice->next_idr_pic_id >= 16)
            slice->next_idr_pic_id = 0;
    }

    slice->pic_order_cnt_lsb = frm->poc & ((1 << slice->log2_max_poc_lsb) - 1);
    slice->num_ref_idx_active = 1;
    slice->no_output_of_prior_pics = 0;
    if (slice->idr_flag)
        slice->long_term_reference_flag = frm->status.is_lt_ref;
    else
        slice->long_term_reference_flag = 0;

    return MPP_OK;
}